

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::DockContextCalcDropPosForDocking
               (ImGuiWindow_conflict *target,ImGuiDockNode *target_node,
               ImGuiWindow_conflict *payload,ImGuiDir split_dir,bool split_outer,ImVec2 *out_pos)

{
  ImVec2 IVar1;
  bool bVar2;
  ImGuiDockPreviewData split_data;
  ImGuiDockPreviewData local_158;
  
  if ((target_node != (ImGuiDockNode *)0x0) && (target_node->ParentNode == (ImGuiDockNode *)0x0)) {
    split_outer = (bool)(split_dir != -1 & (*(byte *)((long)&target_node->MergedFlags + 1) & 8) >> 3
                        | split_outer);
  }
  ImGuiDockPreviewData::ImGuiDockPreviewData(&local_158);
  DockNodePreviewDockSetup(target,target_node,payload,&local_158,false,split_outer);
  bVar2 = local_158.DropRectsDraw[(long)split_dir + 1].Min.y <=
          local_158.DropRectsDraw[(long)split_dir + 1].Max.y &&
          local_158.DropRectsDraw[(long)split_dir + 1].Min.x <=
          local_158.DropRectsDraw[(long)split_dir + 1].Max.x;
  if (bVar2) {
    IVar1 = ImRect::GetCenter(local_158.DropRectsDraw + (long)split_dir + 1);
    *out_pos = IVar1;
  }
  ImGuiDockNode::~ImGuiDockNode(&local_158.FutureNode);
  return bVar2;
}

Assistant:

bool ImGui::DockContextCalcDropPosForDocking(ImGuiWindow* target, ImGuiDockNode* target_node, ImGuiWindow* payload, ImGuiDir split_dir, bool split_outer, ImVec2* out_pos)
{
    // In DockNodePreviewDockSetup() for a root central node instead of showing both "inner" and "outer" drop rects
    // (which would be functionally identical) we only show the outer one. Reflect this here.
    if (target_node && target_node->ParentNode == NULL && target_node->IsCentralNode() && split_dir != ImGuiDir_None)
        split_outer = true;
    ImGuiDockPreviewData split_data;
    DockNodePreviewDockSetup(target, target_node, payload, &split_data, false, split_outer);
    if (split_data.DropRectsDraw[split_dir+1].IsInverted())
        return false;
    *out_pos = split_data.DropRectsDraw[split_dir+1].GetCenter();
    return true;
}